

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool check_noproxy(char *name,char *no_proxy)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    iVar1 = Curl_raw_equal("*",no_proxy);
    if (iVar1 != 0) {
      return true;
    }
    sVar2 = strlen(no_proxy);
    pcVar3 = strchr(name,0x3a);
    if (pcVar3 == (char *)0x0) {
      sVar7 = strlen(name);
    }
    else {
      sVar7 = (long)pcVar3 - (long)name;
    }
    if (sVar2 != 0) {
      uVar4 = 0;
      do {
        uVar9 = uVar4 + 1;
        if (uVar4 + 1 < sVar2) {
          uVar9 = sVar2;
        }
        do {
          uVar5 = uVar4;
          if ((0x2c < (ulong)(byte)no_proxy[uVar4]) ||
             ((0x100100000001U >> ((ulong)(byte)no_proxy[uVar4] & 0x3f) & 1) == 0)) break;
          uVar4 = uVar4 + 1;
          uVar5 = uVar9;
        } while (uVar9 != uVar4);
        if (uVar5 == sVar2) {
          return false;
        }
        uVar4 = uVar5;
        sVar6 = uVar5;
        if (uVar5 < sVar2) {
          do {
            if (((ulong)(byte)no_proxy[sVar6] < 0x2d) &&
               (uVar4 = sVar6, (0x100100000001U >> ((ulong)(byte)no_proxy[sVar6] & 0x3f) & 1) != 0))
            break;
            sVar6 = sVar6 + 1;
            uVar4 = sVar2;
          } while (sVar2 != sVar6);
        }
        lVar8 = (no_proxy[uVar5] == '.') + uVar5;
        uVar9 = uVar4 - lVar8;
        if (uVar9 <= sVar7) {
          iVar1 = Curl_raw_nequal(no_proxy + lVar8,name + (sVar7 - uVar9),uVar9);
          if ((iVar1 != 0) && ((uVar9 == sVar7 || ((name + (sVar7 - uVar9))[-1] == '.')))) {
            return true;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < sVar2);
    }
  }
  return false;
}

Assistant:

static bool check_noproxy(const char* name, const char* no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  size_t tok_start;
  size_t tok_end;
  const char* separator = ", ";
  size_t no_proxy_len;
  size_t namelen;
  char *endptr;

  if(no_proxy && no_proxy[0]) {
    if(Curl_raw_equal("*", no_proxy)) {
      return TRUE;
    }

    /* NO_PROXY was specified and it wasn't just an asterisk */

    no_proxy_len = strlen(no_proxy);
    endptr = strchr(name, ':');
    if(endptr)
      namelen = endptr - name;
    else
      namelen = strlen(name);

    for(tok_start = 0; tok_start < no_proxy_len; tok_start = tok_end + 1) {
      while(tok_start < no_proxy_len &&
            strchr(separator, no_proxy[tok_start]) != NULL) {
        /* Look for the beginning of the token. */
        ++tok_start;
      }

      if(tok_start == no_proxy_len)
        break; /* It was all trailing separator chars, no more tokens. */

      for(tok_end = tok_start; tok_end < no_proxy_len &&
            strchr(separator, no_proxy[tok_end]) == NULL; ++tok_end)
        /* Look for the end of the token. */
        ;

      /* To match previous behaviour, where it was necessary to specify
       * ".local.com" to prevent matching "notlocal.com", we will leave
       * the '.' off.
       */
      if(no_proxy[tok_start] == '.')
        ++tok_start;

      if((tok_end - tok_start) <= namelen) {
        /* Match the last part of the name to the domain we are checking. */
        const char *checkn = name + namelen - (tok_end - tok_start);
        if(Curl_raw_nequal(no_proxy + tok_start, checkn,
                           tok_end - tok_start)) {
          if((tok_end - tok_start) == namelen || *(checkn - 1) == '.') {
            /* We either have an exact match, or the previous character is a .
             * so it is within the same domain, so no proxy for this host.
             */
            return TRUE;
          }
        }
      } /* if((tok_end - tok_start) <= namelen) */
    } /* for(tok_start = 0; tok_start < no_proxy_len;
         tok_start = tok_end + 1) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}